

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O2

NULLCArray __thiscall
NULLCPugiXML::xml_node__child_value1(NULLCPugiXML *this,NULLCArray name,xml_node *ptr)

{
  char_t *__s;
  size_t sVar1;
  uint uVar2;
  NULLCArray NVar3;
  
  if (this == (NULLCPugiXML *)0x0) {
    uVar2 = 0;
    nullcThrowError("name is empty",name.ptr);
    __s = (char_t *)0x0;
  }
  else {
    __s = pugi::xml_node::child_value
                    ((xml_node *)CONCAT44((int)((ulong)register0x00000010 >> 0x20),name.len),
                     (char_t *)this);
    sVar1 = strlen(__s);
    uVar2 = (int)sVar1 + 1;
  }
  NVar3.len = uVar2;
  NVar3.ptr = __s;
  return NVar3;
}

Assistant:

NULLCArray xml_node__child_value1(NULLCArray name, xml_node* ptr)
	{
		if(!name.ptr)
		{
			nullcThrowError("name is empty");
			return NULLCArray();
		}
		NULLCArray ret;
		ret.ptr = (pugi::char_t*)ptr->node.child_value(name.ptr);
		ret.len = (unsigned)strlen(ret.ptr) + 1;
		return ret;
	}